

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

void borg_clean_3(void)

{
  wchar_t local_c;
  wchar_t i;
  
  mem_free(borg_artego_what);
  borg_artego_what = (int16_t *)0x0;
  if (borg_artego_text != (char **)0x0) {
    for (local_c = L'\0'; local_c < borg_artego_size; local_c = local_c + L'\x01') {
      string_free(borg_artego_text[local_c]);
    }
    mem_free(borg_artego_text);
    borg_artego_text = (char **)0x0;
  }
  borg_artego_size = L'\0';
  mem_free(borg_sv_art_text);
  borg_sv_art_text = (char **)0x0;
  mem_free(borg_single_what);
  borg_single_what = (int16_t *)0x0;
  if (borg_single_text != (char **)0x0) {
    for (local_c = L'\0'; local_c < borg_single_size; local_c = local_c + L'\x01') {
      string_free(borg_single_text[local_c]);
    }
    mem_free(borg_single_text);
    borg_single_text = (char **)0x0;
  }
  borg_single_size = L'\0';
  mem_free(borg_plural_what);
  borg_plural_what = (int16_t *)0x0;
  if (borg_plural_text != (char **)0x0) {
    for (local_c = L'\0'; local_c < borg_plural_size; local_c = local_c + L'\x01') {
      string_free(borg_plural_text[local_c]);
    }
    mem_free(borg_plural_text);
    borg_plural_text = (char **)0x0;
  }
  borg_plural_size = L'\0';
  mem_free(borg_sv_plural_text);
  borg_sv_plural_text = (char **)0x0;
  mem_free(safe_shops);
  safe_shops = (borg_shop *)0x0;
  mem_free(safe_home);
  safe_home = (borg_item *)0x0;
  mem_free(safe_items);
  safe_items = (borg_item *)0x0;
  mem_free(borg_shops);
  borg_shops = (borg_shop *)0x0;
  mem_free(borg_items);
  borg_items = (borg_item *)0x0;
  return;
}

Assistant:

void borg_clean_3(void)
{
    int i;

    mem_free(borg_artego_what);
    borg_artego_what = NULL;
    if (borg_artego_text) {
        for (i = 0; i < borg_artego_size; ++i) {
            string_free(borg_artego_text[i]);
        }
        mem_free(borg_artego_text);
        borg_artego_text = NULL;
    }
    borg_artego_size = 0;
    mem_free(borg_sv_art_text);
    borg_sv_art_text = NULL;
    mem_free(borg_single_what);
    borg_single_what = NULL;
    if (borg_single_text) {
        for (i = 0; i < borg_single_size; ++i) {
            string_free(borg_single_text[i]);
        }
        mem_free(borg_single_text);
        borg_single_text = NULL;
    }
    borg_single_size = 0;
    mem_free(borg_plural_what);
    borg_plural_what = NULL;
    if (borg_plural_text) {
        for (i = 0; i < borg_plural_size; ++i) {
            string_free(borg_plural_text[i]);
        }
        mem_free(borg_plural_text);
        borg_plural_text = NULL;
    }
    borg_plural_size = 0;
    mem_free(borg_sv_plural_text);
    borg_sv_plural_text = NULL;
    mem_free(safe_shops);
    safe_shops = NULL;
    mem_free(safe_home);
    safe_home = NULL;
    mem_free(safe_items);
    safe_items = NULL;
    mem_free(borg_shops);
    borg_shops = NULL;
    mem_free(borg_items);
    borg_items = NULL;
}